

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FZFile.cpp
# Opt level: O0

void __thiscall FZFile::decode(FZFile *this,char *source,size_t size)

{
  uint uVar1;
  size_type __n;
  uint uVar2;
  uint32_t b;
  uint32_t b_00;
  const_reference pvVar3;
  ulong in_RDX;
  long in_RSI;
  uint32_t i_1;
  uint32_t tmp;
  uint32_t u;
  uint32_t t;
  uint32_t i;
  size_t pos;
  uint8_t ibuf [16];
  uint8_t currentByte;
  uint32_t D;
  uint32_t C;
  uint32_t B;
  uint32_t A;
  uint32_t r;
  int32_t logw;
  uint in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff7c;
  uint32_t in_stack_ffffffffffffff80;
  uint32_t in_stack_ffffffffffffff84;
  uint local_64;
  uint local_54;
  ulong local_50;
  undefined4 local_48;
  int local_44;
  uint local_40;
  undefined4 local_3c;
  byte local_31;
  uint local_30;
  uint local_2c;
  uint local_28;
  uint local_24;
  int local_20;
  int32_t local_1c;
  ulong local_18;
  long local_10;
  
  local_1c = 5;
  local_20 = 0x14;
  local_24 = 0;
  local_28 = 0;
  local_2c = 0;
  local_30 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  memset(&local_48,0,0x10);
  for (local_50 = 0; uVar1 = local_28, local_50 < local_18; local_50 = local_50 + 1) {
    pvVar3 = std::array<unsigned_int,_44UL>::operator[]
                       ((array<unsigned_int,_44UL> *)
                        CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                        CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    uVar2 = local_30;
    local_28 = uVar1 + *pvVar3;
    pvVar3 = std::array<unsigned_int,_44UL>::operator[]
                       ((array<unsigned_int,_44UL> *)
                        CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                        CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    local_30 = uVar2 + *pvVar3;
    for (local_54 = 1; local_54 < local_20 + 1U; local_54 = local_54 + 1) {
      b = rotl32(local_28 * (local_28 * 2 + 1),local_1c);
      b_00 = rotl32(local_30 * (local_30 * 2 + 1),local_1c);
      in_stack_ffffffffffffff80 = rotl32(local_24 ^ b,b_00);
      pvVar3 = std::array<unsigned_int,_44UL>::operator[]
                         ((array<unsigned_int,_44UL> *)
                          CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                          CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      local_24 = in_stack_ffffffffffffff80 + *pvVar3;
      in_stack_ffffffffffffff84 = rotl32(local_2c ^ b_00,b);
      pvVar3 = std::array<unsigned_int,_44UL>::operator[]
                         ((array<unsigned_int,_44UL> *)
                          CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                          CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      uVar1 = local_28;
      local_2c = local_30;
      local_30 = local_24;
      local_28 = in_stack_ffffffffffffff84 + *pvVar3;
      local_24 = uVar1;
    }
    pvVar3 = std::array<unsigned_int,_44UL>::operator[]
                       ((array<unsigned_int,_44UL> *)
                        CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                        CONCAT44(in_stack_ffffffffffffff7c,local_24));
    __n = CONCAT44(local_2c,local_24);
    in_stack_ffffffffffffff78 = local_24;
    local_24 = local_24 + *pvVar3;
    std::array<unsigned_int,_44UL>::operator[]
              ((array<unsigned_int,_44UL> *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),__n);
    local_31 = *(byte *)(local_10 + local_50);
    *(byte *)(local_10 + local_50) = local_31 ^ (byte)local_24;
    for (local_64 = 0; local_64 < 0xf; local_64 = local_64 + 1) {
      *(undefined1 *)((long)&local_48 + (ulong)local_64) =
           *(undefined1 *)((long)&local_48 + (ulong)(local_64 + 1));
    }
    local_3c = CONCAT13(local_31,(undefined3)local_3c);
    local_24 = local_48;
    local_28 = local_44;
    local_30 = local_3c;
    in_stack_ffffffffffffff7c = local_2c;
    local_2c = local_40;
  }
  return;
}

Assistant:

void FZFile::decode(char *source, size_t size) const {
	// Along the lines of http://people.csail.mit.edu/rivest/pubs/RRSY98.pdf
	// (page 3, 2.2)
	int32_t logw = 5;
	uint32_t r   = 20;

	uint32_t A = 0;
	uint32_t B = 0;
	uint32_t C = 0;
	uint32_t D = 0;

	uint8_t currentByte;
	uint8_t ibuf[16] = {0}; // you'll see

	// RC6 algo from the paper, basically 1:1
	for (size_t pos = 0; pos < size; ++pos) {
		B = B + key[0];
		D = D + key[1];
		for (uint32_t i = 1; i < (r + 1); ++i) { // loop offset by 1
			uint32_t t = rotl32(B * (2 * B + 1), logw);
			uint32_t u = rotl32(D * (2 * D + 1), logw);
			A          = rotl32(A ^ t, u) + key[2 * i];
			C          = rotl32(C ^ u, t) + key[2 * i + 1];

			uint32_t tmp = A;
			A            = B;
			B            = C;
			C            = D;
			D            = tmp;
		}
		A = A + key[2 * r + 2];
		C = C + key[2 * r + 3]; // not used I guess

		// rolling over the the uint8_t string
		// buf[pos] xor A -> is our resulting byte
		currentByte = source[pos];
		source[pos] = ((uint8_t)(currentByte ^ (A & 0xFF)));
		// fprintf(stdout,"%c",source[pos]);

		// pushing in a stream of buf[pos] chars 'from the right'
		// and shift whole array 8 bits to the left
		for (uint32_t i = 0; i < 15; ++i) {
			ibuf[i] = ibuf[i + 1];
		}
		ibuf[15] = currentByte;

		// align 4 consequent int32s to that buffer
		// (A, B, C, D) = (buf[0], buf[1], buf[2], buf[3])
		// byte order?!
		A = ibuf[0] | ibuf[1] << 8 | ibuf[2] << 16 | ibuf[3] << 24;
		B = ibuf[4] | ibuf[5] << 8 | ibuf[6] << 16 | ibuf[7] << 24;
		C = ibuf[8] | ibuf[9] << 8 | ibuf[10] << 16 | ibuf[11] << 24;
		D = ibuf[12] | ibuf[13] << 8 | ibuf[14] << 16 | ibuf[15] << 24;
	}
}